

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::rl_e(CPU *this)

{
  uint8_t *puVar1;
  Registers *pRVar2;
  byte bVar3;
  
  pRVar2 = this->regs;
  bVar3 = pRVar2->f;
  pRVar2->f = pRVar2->e >> 3 & 0x10;
  bVar3 = pRVar2->e * '\x02' | bVar3 >> 4 & 1;
  pRVar2->e = bVar3;
  if (bVar3 == 0) {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 2;
}

Assistant:

int CPU::rl_e() {
    rl_r8(regs.e);
    return 2;
}